

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnTable
          (BinaryReaderIR *this,Index index,Type elem_type,Limits *elem_limits)

{
  uint64_t uVar1;
  bool bVar2;
  pointer *__ptr;
  _Head_base<0UL,_wabt::TableModuleField_*,_false> local_58;
  TableModuleField *local_50;
  Location local_48;
  
  GetLocation(&local_48,this);
  MakeUnique<wabt::TableModuleField,wabt::Location>((wabt *)&local_50,&local_48);
  bVar2 = elem_limits->is_shared;
  (local_50->table).elem_limits.has_max = elem_limits->has_max;
  (local_50->table).elem_limits.is_shared = bVar2;
  uVar1 = elem_limits->max;
  (local_50->table).elem_limits.initial = elem_limits->initial;
  (local_50->table).elem_limits.max = uVar1;
  (local_50->table).elem_type.enum_ = elem_type.enum_;
  local_58._M_head_impl = local_50;
  local_50 = (TableModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                       *)&local_58);
  if (local_58._M_head_impl != (TableModuleField *)0x0) {
    (*((local_58._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_58._M_head_impl = (TableModuleField *)0x0;
  if (local_50 != (TableModuleField *)0x0) {
    (**(code **)(*(long *)local_50 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnTable(Index index,
                               Type elem_type,
                               const Limits* elem_limits) {
  auto field = MakeUnique<TableModuleField>(GetLocation());
  Table& table = field->table;
  table.elem_limits = *elem_limits;
  table.elem_type = elem_type;
  module_->AppendField(std::move(field));
  return Result::Ok;
}